

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

ConstantValue *
(anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>(BinaryOperator op,SVInt *l,bool *r)

{
  SVInt *in_RDX;
  undefined4 in_ESI;
  ConstantValue *in_RDI;
  SVInt *in_stack_fffffffffffffef8;
  ConstantValue *in_stack_ffffffffffffff00;
  ConstantValue *this;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  SVInt *in_stack_ffffffffffffff10;
  ConstantValue local_b0;
  uint8_t local_71;
  uint8_t local_59;
  uint8_t local_31;
  
  switch(in_ESI) {
  case 0x13:
    local_31 = (uint8_t)slang::SVInt::operator_cast_to_logic_t(in_stack_fffffffffffffef8);
    slang::operator&&((logic_t)0x0,false);
    slang::SVInt::SVInt<bool>
              ((SVInt *)in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0))
    ;
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  case 0x14:
    local_59 = (uint8_t)slang::SVInt::operator_cast_to_logic_t(in_stack_fffffffffffffef8);
    slang::operator||((logic_t)0x0,false);
    slang::SVInt::SVInt<bool>
              ((SVInt *)in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0))
    ;
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  case 0x15:
    slang::SVInt::SVInt<bool>
              ((SVInt *)in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0))
    ;
    local_71 = (uint8_t)slang::SVInt::logicalImpl
                                  ((SVInt *)CONCAT17(in_stack_ffffffffffffff0f,
                                                     in_stack_ffffffffffffff08),
                                   (SVInt *)in_stack_ffffffffffffff00);
    slang::SVInt::SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                        (logic_t)(uint8_t)((ulong)in_RDX >> 0x38));
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    slang::SVInt::~SVInt(in_RDX);
    slang::SVInt::~SVInt(in_RDX);
    break;
  case 0x16:
    this = &local_b0;
    slang::SVInt::SVInt<bool>((SVInt *)this,SUB81((ulong)in_RDX >> 0x38,0));
    local_b0.value.
    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ._M_u._23_1_ = slang::SVInt::logicalEquiv
                             ((SVInt *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
                              ,(SVInt *)this);
    slang::SVInt::SVInt((SVInt *)CONCAT17(local_b0.value.
                                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          .
                                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          .
                                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          .
                                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          .
                                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          .
                                          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          ._M_u._23_1_,in_stack_ffffffffffffff08),
                        (logic_t)(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38));
    slang::ConstantValue::ConstantValue(this,in_RDX);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  default:
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  return in_RDI;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            // This should only be reachable when speculatively
            // evaluating an expression that hasn't had its
            // type finalized via propagation, which can happen
            // during an analyzeOpTypes call.
            return nullptr;
    }
}